

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void __thiscall
mp::
CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
::CustomFunctionalConstraint
          (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
           *this,Arguments *args,Parameters prm)

{
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumberofConstId>
  *in_RSI;
  FunctionalConstraint *in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Parameters prm_00;
  
  FunctionalConstraint::FunctionalConstraint(in_RDI,in_stack_ffffffffffffffac);
  prm_00._M_elems[0] = (_Type)(in_RDI + 1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumberofConstId>
  ::CustomConstraintData(in_RSI,(Arguments *)in_RDI,prm_00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)prm_00._M_elems[0]);
  return;
}

Assistant:

CustomFunctionalConstraint(Arguments args, Parameters prm) noexcept :
    BaseType(std::move(args), std::move(prm)) { }